

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

VP8StatusCode DecodeInto(uint8_t *data,size_t data_size,WebPDecParams *params)

{
  VP8StatusCode VVar1;
  int iVar2;
  VP8LDecoder *dec;
  VP8Decoder *dec_00;
  WebPHeaderStructure headers;
  VP8Io io;
  WebPHeaderStructure local_108;
  VP8Io local_c0;
  
  local_108.have_all_data = 1;
  local_108.data = data;
  local_108.data_size = data_size;
  VVar1 = WebPParseHeaders(&local_108);
  if (VVar1 != VP8_STATUS_OK) {
    return VVar1;
  }
  iVar2 = VP8InitIoInternal(&local_c0,0x210);
  if (iVar2 == 0) {
    return VP8_STATUS_INVALID_PARAM;
  }
  local_c0.data = local_108.data + local_108.offset;
  local_c0.data_size = local_108.data_size - local_108.offset;
  WebPInitCustomIo(params,&local_c0);
  if (local_108.is_lossless == 0) {
    dec_00 = VP8New();
    if (dec_00 == (VP8Decoder *)0x0) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    dec_00->alpha_data = local_108.alpha_data;
    dec_00->alpha_data_size = local_108.alpha_data_size;
    iVar2 = VP8GetHeaders(dec_00,&local_c0);
    if (iVar2 == 0) {
LAB_00140c8c:
      VVar1 = dec_00->status;
    }
    else {
      VVar1 = WebPAllocateDecBuffer(local_c0.width,local_c0.height,params->options,params->output);
      if (VVar1 == VP8_STATUS_OK) {
        iVar2 = VP8GetThreadMethod(params->options,&local_108,local_c0.width,local_c0.height);
        dec_00->mt_method = iVar2;
        VP8InitDithering(params->options,dec_00);
        iVar2 = VP8Decode(dec_00,&local_c0);
        VVar1 = VP8_STATUS_OK;
        if (iVar2 == 0) goto LAB_00140c8c;
      }
    }
    VP8Delete(dec_00);
    goto LAB_00140c97;
  }
  dec = VP8LNew();
  if (dec == (VP8LDecoder *)0x0) {
    return VP8_STATUS_OUT_OF_MEMORY;
  }
  iVar2 = VP8LDecodeHeader(dec,&local_c0);
  if (iVar2 == 0) {
LAB_00140be2:
    VVar1 = dec->status;
  }
  else {
    VVar1 = WebPAllocateDecBuffer(local_c0.width,local_c0.height,params->options,params->output);
    if (VVar1 == VP8_STATUS_OK) {
      iVar2 = VP8LDecodeImage(dec);
      VVar1 = VP8_STATUS_OK;
      if (iVar2 == 0) goto LAB_00140be2;
    }
  }
  VP8LDelete(dec);
LAB_00140c97:
  if (VVar1 == VP8_STATUS_OK) {
    VVar1 = VP8_STATUS_OK;
    if ((params->options != (WebPDecoderOptions *)0x0) && (params->options->flip != 0)) {
      VVar1 = WebPFlipBuffer(params->output);
    }
  }
  else {
    WebPFreeDecBuffer(params->output);
  }
  return VVar1;
}

Assistant:

WEBP_NODISCARD static VP8StatusCode DecodeInto(const uint8_t* const data,
                                               size_t data_size,
                                               WebPDecParams* const params) {
  VP8StatusCode status;
  VP8Io io;
  WebPHeaderStructure headers;

  headers.data = data;
  headers.data_size = data_size;
  headers.have_all_data = 1;
  status = WebPParseHeaders(&headers);   // Process Pre-VP8 chunks.
  if (status != VP8_STATUS_OK) {
    return status;
  }

  assert(params != NULL);
  if (!VP8InitIo(&io)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  io.data = headers.data + headers.offset;
  io.data_size = headers.data_size - headers.offset;
  WebPInitCustomIo(params, &io);  // Plug the I/O functions.

  if (!headers.is_lossless) {
    VP8Decoder* const dec = VP8New();
    if (dec == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    dec->alpha_data = headers.alpha_data;
    dec->alpha_data_size = headers.alpha_data_size;

    // Decode bitstream header, update io->width/io->height.
    if (!VP8GetHeaders(dec, &io)) {
      status = dec->status;   // An error occurred. Grab error status.
    } else {
      // Allocate/check output buffers.
      status = WebPAllocateDecBuffer(io.width, io.height, params->options,
                                     params->output);
      if (status == VP8_STATUS_OK) {  // Decode
        // This change must be done before calling VP8Decode()
        dec->mt_method = VP8GetThreadMethod(params->options, &headers,
                                            io.width, io.height);
        VP8InitDithering(params->options, dec);
        if (!VP8Decode(dec, &io)) {
          status = dec->status;
        }
      }
    }
    VP8Delete(dec);
  } else {
    VP8LDecoder* const dec = VP8LNew();
    if (dec == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    if (!VP8LDecodeHeader(dec, &io)) {
      status = dec->status;   // An error occurred. Grab error status.
    } else {
      // Allocate/check output buffers.
      status = WebPAllocateDecBuffer(io.width, io.height, params->options,
                                     params->output);
      if (status == VP8_STATUS_OK) {  // Decode
        if (!VP8LDecodeImage(dec)) {
          status = dec->status;
        }
      }
    }
    VP8LDelete(dec);
  }

  if (status != VP8_STATUS_OK) {
    WebPFreeDecBuffer(params->output);
  } else {
    if (params->options != NULL && params->options->flip) {
      // This restores the original stride values if options->flip was used
      // during the call to WebPAllocateDecBuffer above.
      status = WebPFlipBuffer(params->output);
    }
  }
  return status;
}